

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeVectorType(Builder *this,Id component,int size)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  Id *pIVar3;
  iterator iVar4;
  iterator __position;
  Instruction *in_RAX;
  Id IVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  Instruction *type;
  Instruction *local_28;
  _Head_base<0UL,_spv::Instruction_*,_false> local_20;
  
  ppIVar2 = this->groupedTypes[0x17].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)this->groupedTypes[0x17].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
  bVar8 = 0 < (int)uVar6;
  if (0 < (int)uVar6) {
    uVar7 = 1;
    do {
      local_28 = ppIVar2[uVar7 - 1];
      pIVar3 = (local_28->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((*pIVar3 == component) && (pIVar3[1] == size)) {
        in_RAX = (Instruction *)(ulong)local_28->resultId;
        break;
      }
      bVar8 = uVar7 < (uVar6 & 0x7fffffff);
      bVar9 = uVar7 != (uVar6 & 0x7fffffff);
      in_RAX = local_28;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  IVar5 = (Id)in_RAX;
  if (!bVar8) {
    local_28 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    local_28->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    local_28->resultId = IVar5;
    local_28->typeId = 0;
    local_28->opCode = OpTypeVector;
    (local_28->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_28->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28->block = (Block *)0x0;
    iVar4._M_current =
         (local_28->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (local_28->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_20._M_head_impl._0_4_ = component;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_28->operands,iVar4,(uint *)&local_20);
    }
    else {
      *iVar4._M_current = component;
      (local_28->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    local_20._M_head_impl._0_4_ = size;
    iVar4._M_current =
         (local_28->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (local_28->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_28->operands,iVar4,(uint *)&local_20);
    }
    else {
      *iVar4._M_current = size;
      (local_28->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    __position._M_current =
         this->groupedTypes[0x17].
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        this->groupedTypes[0x17].
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>
                ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
                 (this->groupedTypes + 0x17),__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      pppIVar1 = &this->groupedTypes[0x17].
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    local_20._M_head_impl = local_28;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_20);
    if (local_20._M_head_impl != (Instruction *)0x0) {
      (*(local_20._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,local_28);
    IVar5 = local_28->resultId;
  }
  return IVar5;
}

Assistant:

Id Builder::makeVectorType(Id component, int size)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeVector].size(); ++t) {
        type = groupedTypes[OpTypeVector][t];
        if (type->getIdOperand(0) == component &&
            type->getImmediateOperand(1) == (unsigned)size)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeVector);
    type->addIdOperand(component);
    type->addImmediateOperand(size);
    groupedTypes[OpTypeVector].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}